

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O3

void audit_regressor_lda(audit_regressor_data *rd,single_learner *param_2,example *ec)

{
  sparse_parameters *this;
  byte bVar1;
  vw *pvVar2;
  vw *pvVar3;
  element_type *peVar4;
  _func_void_weight_ptr_void_ptr *p_Var5;
  io_buf *this_00;
  char *data;
  ostream *poVar6;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  float *pfVar11;
  features *pfVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t index;
  ostringstream tempstream;
  char *local_218;
  float *local_210;
  char local_208 [16];
  audit_regressor_data *local_1f8;
  example *local_1f0;
  features *local_1e8;
  byte *local_1e0;
  uint32_t *local_1d8;
  uint32_t *local_1d0;
  char *local_1c8;
  uint local_1c0;
  char local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pvVar2 = rd->all;
  local_1f8 = rd;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pbVar9 = (ec->super_example_predict).indices._begin;
  pbVar8 = (ec->super_example_predict).indices._end;
  local_1f0 = ec;
  if (pbVar9 != pbVar8) {
    pvVar3 = local_1f8->all;
    pfVar12 = (ec->super_example_predict).feature_space;
    this = &(pvVar3->weights).sparse_weights;
    local_1d0 = &(pvVar3->weights).sparse_weights._stride_shift;
    local_1d8 = &(pvVar3->weights).dense_weights._stride_shift;
    local_1e8 = pfVar12;
    do {
      bVar1 = *pbVar9;
      if (pfVar12[bVar1].values._end != pfVar12[bVar1].values._begin) {
        pfVar12 = pfVar12 + bVar1;
        uVar14 = 0;
        local_1e0 = pbVar9;
        do {
          local_218._0_1_ = 9;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)&local_218,1);
          peVar4 = (pfVar12->space_names)._begin[uVar14].
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(peVar4->first)._M_dataplus._M_p,
                              (peVar4->first)._M_string_length);
          local_218._0_1_ = 0x5e;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_218,1);
          peVar4 = (pfVar12->space_names)._begin[uVar14].
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(peVar4->second)._M_dataplus._M_p,
                              (peVar4->second)._M_string_length);
          local_218 = (char *)CONCAT71(local_218._1_7_,0x3a);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_218,1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          if (pvVar2->lda != 0) {
            uVar13 = 0;
            do {
              uVar10 = (pfVar12->indicies)._begin[uVar14] + uVar13;
              if ((pvVar3->weights).sparse == true) {
                local_1c8 = (char *)(uVar10 & (pvVar3->weights).sparse_weights._weight_mask);
                _Var7._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                       *)this,(key_type *)&local_1c8);
                if (_Var7._M_cur == (__node_type *)0x0) {
                  local_210 = calloc_or_throw<float>
                                        (1L << ((byte)(pvVar3->weights).sparse_weights._stride_shift
                                               & 0x3f));
                  local_218 = local_1c8;
                  std::
                  _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<std::pair<unsigned_long,float*>>
                            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)this,&local_218);
                  _Var7._M_cur = (__node_type *)
                                 std::
                                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                         *)this,(key_type *)&local_1c8);
                  p_Var5 = (pvVar3->weights).sparse_weights.fun;
                  if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                    (*p_Var5)(*(weight **)((long)_Var7._M_cur + 0x10),
                              (pvVar3->weights).sparse_weights.default_data);
                  }
                }
                pfVar11 = *(float **)
                           ((long)&((_Var7._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                   ._M_storage._M_storage + 8);
              }
              else {
                pfVar11 = (pvVar3->weights).dense_weights._begin +
                          (uVar10 & (pvVar3->weights).dense_weights._weight_mask);
              }
              local_218 = (char *)CONCAT71(local_218._1_7_,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_218,1);
              std::ostream::_M_insert<double>((double)*pfVar11);
              *pfVar11 = 0.0;
              uVar13 = uVar13 + 1;
            } while (uVar13 < pvVar2->lda);
          }
          std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + (char)local_1a8);
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)(pfVar12->values)._end - (long)(pfVar12->values)._begin >> 2
                                 ));
        pbVar8 = (local_1f0->super_example_predict).indices._end;
        pbVar9 = local_1e0;
        pfVar12 = local_1e8;
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar8);
  }
  this_00 = local_1f8->out_file;
  std::__cxx11::stringbuf::str();
  data = local_218;
  std::__cxx11::stringbuf::str();
  io_buf::bin_write_fixed(this_00,data,(ulong)local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void audit_regressor_lda(audit_regressor_data& rd, LEARNER::single_learner& /* base */, example& ec)
{
  vw& all = *rd.all;

  ostringstream tempstream;
  parameters& weights = rd.all->weights;
  for (unsigned char* i = ec.indices.begin(); i != ec.indices.end(); i++)
  {
    features& fs = ec.feature_space[*i];
    for (size_t j = 0; j < fs.size(); ++j)
    {
      tempstream << '\t' << fs.space_names[j].get()->first << '^' << fs.space_names[j].get()->second << ':'
                 << ((fs.indicies[j] >> weights.stride_shift()) & all.parse_mask);
      for (size_t k = 0; k < all.lda; k++)
      {
        weight& w = weights[(fs.indicies[j] + k)];
        tempstream << ':' << w;
        w = 0.;
      }
      tempstream << endl;
    }
  }

  rd.out_file->bin_write_fixed(tempstream.str().c_str(), (uint32_t)tempstream.str().size());
}